

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gv_visitor.cpp
# Opt level: O2

void __thiscall gv_visitor::visit(gv_visitor *this,NotLastExpressions *ptr)

{
  Multiple_expressions *second;
  Expr *second_00;
  string local_48;
  allocator<char> local_21;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"mnogo expr2",&local_21);
  box(this,ptr,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  second = ptr->prev_exprs;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"prev",&local_21);
  arrow(this,ptr,second,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  (**(ptr->prev_exprs->super_Base)._vptr_Base)(ptr->prev_exprs,this);
  second_00 = ptr->expr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"last",&local_21);
  arrow(this,ptr,second_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  (**(ptr->expr->super_Base)._vptr_Base)(ptr->expr,this);
  return;
}

Assistant:

void gv_visitor::visit(NotLastExpressions* ptr) {
    box(ptr, "mnogo expr2");
    arrow(ptr, ptr->prev_exprs, "prev");
    ptr->prev_exprs->accept(this);
    arrow(ptr, ptr->expr, "last");
    ptr->expr->accept(this);
}